

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O1

int ON_SHA1_Hash::Compare(ON_SHA1_Hash *a,ON_SHA1_Hash *b)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    bVar1 = b->m_digest[lVar3];
    bVar2 = a->m_digest[lVar3];
    if (bVar2 < bVar1) {
      return -1;
    }
    if (bVar2 >= bVar1 && bVar2 != bVar1) break;
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x14) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int ON_SHA1_Hash::Compare(
  const ON_SHA1_Hash& a,
  const ON_SHA1_Hash& b
  )
{
  for (int i = 0; i < 20; i++)
  {
    if (a.m_digest[i] < b.m_digest[i])
      return -1;
    if (a.m_digest[i] > b.m_digest[i])
      return 1;
  }
  return 0;
}